

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ExternalInstanceRef *name)

{
  ModuleFieldType MVar1;
  const_iterator cVar2;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->import_syms_)._M_t,(name->super_GlobalName).name);
  MVar1 = (name->super_GlobalName).type;
  if ((_Rb_tree_header *)cVar2._M_node != &(this->import_syms_)._M_t._M_impl.super__Rb_tree_header)
  {
    WriteData(this,"(*instance->",0xc);
    Write(this,(GlobalName *)(ulong)MVar1);
    WriteData(this,")",1);
    return;
  }
  WriteData(this,"instance->",10);
  Write(this,(GlobalName *)(ulong)MVar1);
  return;
}

Assistant:

void CWriter::Write(const ExternalInstanceRef& name) {
  bool is_import = import_syms_.count(name.name) != 0;
  if (is_import) {
    Write("(*instance->", GlobalName(name), ")");
  } else {
    Write("instance->", GlobalName(name));
  }
}